

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O2

void Llb_ManComputeIndCase(Aig_Man_t *p,DdManager *dd,Vec_Int_t *vNodes)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p_01;
  void **__s;
  DdNode *pDVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  DdNode *g;
  int iVar6;
  int iVar7;
  
  iVar7 = p->vObjs->nSize;
  p_01 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar7 - 1U) {
    iVar1 = iVar7;
  }
  p_01->nCap = iVar1;
  iVar6 = 0;
  if (iVar1 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar1 << 3);
  }
  p_01->pArray = __s;
  p_01->nSize = iVar7;
  memset(__s,0,(long)iVar7 << 3);
  pDVar3 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar3);
  Vec_PtrWriteEntry(p_01,p->pConst1->Id,pDVar3);
  for (; iVar6 < p->nTruePis; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar6);
    pDVar3 = Cudd_bddIthVar(dd,p->nObjs[2] + iVar6);
    Cudd_Ref(pDVar3);
    Vec_PtrWriteEntry(p_01,*(int *)((long)pvVar4 + 0x24),pDVar3);
  }
  iVar7 = 0;
  while( true ) {
    if (p->nRegs <= iVar7) {
      for (iVar7 = 0; iVar7 < vNodes->nSize; iVar7 = iVar7 + 1) {
        uVar2 = Vec_IntEntry(vNodes,iVar7);
        if (uVar2 < 2) {
          pAVar5 = Aig_ManObj(p,iVar7);
          g = Llb_ManComputeIndCase_rec(p,pAVar5,dd,p_01);
          pDVar3 = (DdNode *)(pAVar5->field_5).pData;
          if (uVar2 == 0) {
            pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
            g = (DdNode *)((ulong)g ^ 1);
          }
          iVar1 = Cudd_bddLeq(dd,pDVar3,g);
          if (iVar1 == 0) {
            Vec_IntWriteEntry(vNodes,iVar7,-1);
          }
        }
      }
      for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
        pDVar3 = (DdNode *)Vec_PtrEntry(p_01,iVar7);
        if (pDVar3 != (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
        }
      }
      free(p_01->pArray);
      free(p_01);
      return;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar7);
    pDVar3 = (DdNode *)(pAVar5->field_5).pData;
    Cudd_Ref(pDVar3);
    if ((*(uint *)&pAVar5->field_0x18 & 7) != 3) break;
    iVar1 = Aig_ObjCioId(pAVar5);
    if (iVar1 < p->nTruePos) break;
    p_00 = p->vCis;
    iVar1 = p->nTruePis;
    iVar6 = Aig_ObjCioId(pAVar5);
    pvVar4 = Vec_PtrEntry(p_00,(iVar1 + iVar6) - p->nTruePos);
    Vec_PtrWriteEntry(p_01,*(int *)((long)pvVar4 + 0x24),pDVar3);
    iVar7 = iVar7 + 1;
  }
  __assert_fail("Saig_ObjIsLi(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Llb_ManComputeIndCase( Aig_Man_t * p, DdManager * dd, Vec_Int_t * vNodes )
{
    Vec_Ptr_t * vBdds;
    Aig_Obj_t * pObj;
    DdNode * bFunc;
    int i, Entry;
    vBdds = Vec_PtrStart( Aig_ManObjNumMax(p) );
    bFunc = Cudd_ReadOne(dd); Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(Aig_ManConst1(p)), bFunc );
    Saig_ManForEachPi( p, pObj, i )
    {
        bFunc = Cudd_bddIthVar( dd, Aig_ManCiNum(p) + i );  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        bFunc = (DdNode *)pObj->pData;  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(Saig_ObjLiToLo(p, pObj)), bFunc );
    }
    Vec_IntForEachEntry( vNodes, Entry, i )
    { 
        if ( Entry != 0 && Entry != 1 )
            continue;
        pObj = Aig_ManObj( p, i );
        bFunc = Llb_ManComputeIndCase_rec( p, pObj, dd, vBdds );
        if ( Entry == 0 )
        {
//            Extra_bddPrint( dd, Cudd_Not(pObj->pData) );  printf( "\n" );
//            Extra_bddPrint( dd, Cudd_Not(bFunc) );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, Cudd_Not(pObj->pData), Cudd_Not(bFunc) ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
        else if ( Entry == 1 )
        {
//            Extra_bddPrint( dd, pObj->pData );  printf( "\n" );
//            Extra_bddPrint( dd, bFunc );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, (DdNode *)pObj->pData, bFunc ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
    }
    Vec_PtrForEachEntry( DdNode *, vBdds, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vBdds );
}